

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_system.cpp
# Opt level: O0

void __thiscall LinearSystem::LinearSystem(LinearSystem *this,Matrix *a,Matrix *b,Mode mode)

{
  Matrix local_f0;
  Matrix local_d0;
  ExtendedMatrix local_b0;
  Mode local_24;
  Matrix *pMStack_20;
  Mode mode_local;
  Matrix *b_local;
  Matrix *a_local;
  LinearSystem *this_local;
  
  local_24 = mode;
  pMStack_20 = b;
  b_local = a;
  a_local = (Matrix *)this;
  Matrix::Matrix(&local_d0,a);
  Matrix::Matrix(&local_f0,pMStack_20);
  ExtendedMatrix::ExtendedMatrix(&local_b0,&local_d0,&local_f0);
  LinearSystem(this,&local_b0,local_24);
  ExtendedMatrix::~ExtendedMatrix(&local_b0);
  Matrix::~Matrix(&local_f0);
  Matrix::~Matrix(&local_d0);
  return;
}

Assistant:

LinearSystem::LinearSystem(const Matrix& a, const Matrix& b, Mode mode)
    : LinearSystem(ExtendedMatrix(a, b), mode) {}